

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_SampleBuffers.h
# Opt level: O1

SeparateChannelLayout<float> choc::buffer::SeparateChannelLayout<float>::createAllocated(Size size)

{
  void *pvVar1;
  ChannelCount i;
  ulong uVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  SeparateChannelLayout<float> SVar6;
  
  if (size.numChannels == 0) {
    pvVar3 = operator_new__(8);
    *(void **)pvVar3 = pvVar3;
  }
  else {
    uVar4 = (ulong)(((uint)((ulong)size >> 0x1e) & 0xfffffffc) + 0xf & 0xfffffff0);
    uVar5 = (ulong)size & 0xffffffff;
    pvVar1 = operator_new__((uVar4 + 8) * uVar5);
    pvVar3 = (void *)(uVar4 * uVar5 + (long)pvVar1);
    uVar2 = 0;
    do {
      *(void **)((long)pvVar3 + uVar2 * 8) = pvVar1;
      uVar2 = uVar2 + 1;
      pvVar1 = (void *)((long)pvVar1 + uVar4);
    } while (uVar5 != uVar2);
  }
  SVar6._8_8_ = 0;
  SVar6.channels = (float **)pvVar3;
  return SVar6;
}

Assistant:

static SeparateChannelLayout createAllocated (Size size)
    {
        if (size.numChannels == 0)
        {
            auto allocated = new void*[1];
            *allocated = allocated;
            return { reinterpret_cast<SampleType* const*> (allocated), 0 };
        }

        auto channelDataSize = getChannelDataSize (size.numFrames);
        auto dataSize = channelDataSize * size.numChannels;
        auto listSize = sizeof (SampleType*) * size.numChannels;
        auto allocated = new char[dataSize + listSize];
        auto list = reinterpret_cast<SampleType**> (allocated + dataSize);

        for (decltype (size.numChannels) i = 0; i < size.numChannels; ++i)
            list[i] = reinterpret_cast<SampleType*> (allocated + i * channelDataSize);

        return { list, 0 };
    }